

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtmochelpers.h
# Opt level: O0

bool __thiscall
QtMocHelpers::
indexOfMethod<void(QEvdevMouseHandler::*)(int,int,bool,QFlags<Qt::MouseButton>,Qt::MouseButton,QEvent::Type)>
          (QtMocHelpers *this,void **_a,offset_in_QEvdevMouseHandler_to_subr f,int index)

{
  void **ppvVar1;
  bool bVar2;
  offset_in_QEvdevMouseHandler_to_subr *candidate;
  int *result;
  int index_local;
  offset_in_QEvdevMouseHandler_to_subr f_local;
  void **_a_local;
  bool local_1;
  
  ppvVar1 = (void **)**(long **)(this + 8);
  bVar2 = (*(long **)(this + 8))[1] == f;
  if (ppvVar1 == _a && (ppvVar1 == (void **)0x0 || bVar2)) {
    **(int **)this = index;
  }
  local_1 = ppvVar1 == _a && (ppvVar1 == (void **)0x0 || bVar2);
  return local_1;
}

Assistant:

inline bool indexOfMethod(void **_a, FuncType f, int index) noexcept
{
    int *result = static_cast<int *>(_a[0]);
    auto candidate = reinterpret_cast<FuncType *>(_a[1]);
    if (*candidate != f)
        return false;
    *result = index;
    return true;
}